

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O0

void http1_on_ready(intptr_t uuid,fio_protocol_s *protocol)

{
  http1pr_s *p;
  fio_protocol_s *protocol_local;
  intptr_t uuid_local;
  
  if (((ulong)protocol[5].on_shutdown & 0x40000) != 0) {
    *(byte *)((long)&protocol[5].on_shutdown + 2) =
         *(byte *)((long)&protocol[5].on_shutdown + 2) ^ 4;
    fio_force_event(uuid,FIO_EVENT_ON_DATA);
  }
  return;
}

Assistant:

static void http1_on_ready(intptr_t uuid, fio_protocol_s *protocol) {
  /* resume slow clients from suspension */
  http1pr_s *p = (http1pr_s *)protocol;
  if (p->stop & 4) {
    p->stop ^= 4; /* flip back the bit, so it's zero */
    fio_force_event(uuid, FIO_EVENT_ON_DATA);
  }
  (void)protocol;
}